

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_abs32_sparc(void *d,void *a,uint32_t desc)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = desc * 8 & 0xff;
  uVar3 = 0;
  do {
    iVar1 = *(int *)((long)a + uVar3);
    iVar4 = -iVar1;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    *(int *)((long)d + uVar3) = iVar4;
    uVar3 = uVar3 + 4;
  } while (uVar3 < uVar2 + 8);
  if ((desc >> 2 & 0xf8) <= uVar2) {
    return;
  }
  helper_gvec_abs32_sparc_cold_1();
  return;
}

Assistant:

void HELPER(gvec_abs32)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        int32_t aa = *(int32_t *)((char *)a + i);
        *(int32_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}